

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

word wwShHiCarry(word *a,size_t n,size_t shift,word carry)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar2 = n * 0x40 + 0x40;
  uVar6 = shift - uVar2;
  if (uVar2 <= shift) {
    wwSetZero(a,n);
    if (0x3f < uVar6) {
      return 0;
    }
    return carry << ((byte)uVar6 & 0x3f);
  }
  uVar2 = shift >> 6;
  bVar1 = (byte)shift;
  bVar4 = bVar1 & 0x3f;
  if (shift < 0x40) {
    uVar6 = 0;
  }
  else {
    uVar6 = a[n - uVar2] << bVar4;
  }
  lVar7 = -1;
  if ((shift & 0x3f) == 0) {
    for (; uVar2 < n; n = n - 1) {
      a[n - 1] = a[(n - 1) - uVar2];
    }
    uVar5 = n - 1;
LAB_00130528:
    uVar3 = uVar5;
    if (uVar5 == 0xffffffffffffffff) goto LAB_0013054a;
  }
  else {
    uVar3 = carry;
    if (uVar2 < n) {
      uVar3 = a[~uVar2 + n];
    }
    for (uVar5 = n - 2; (uVar5 != 0xfffffffffffffffe && (uVar2 < uVar5 + 1)); uVar5 = uVar5 - 1) {
      a[uVar5 + 1] = a[(uVar5 + 1) - uVar2] << (bVar1 & 0x3f) |
                     a[uVar5 - uVar2] >> 0x40 - (bVar1 & 0x3f);
    }
    uVar6 = uVar3 >> (-bVar4 & 0x3f) | uVar6;
    if (uVar5 == 0xfffffffffffffffe) goto LAB_0013054a;
    uVar3 = uVar5 + 1;
    if (uVar2 < uVar5 + 2) {
      a[uVar5 + 1] = a[(uVar5 + 1) - uVar2] << (bVar1 & 0x3f) | carry >> 0x40 - (bVar1 & 0x3f);
      goto LAB_00130528;
    }
  }
  a[uVar3] = carry << bVar4;
  lVar7 = uVar3 - 1;
LAB_0013054a:
  for (; lVar7 != -1; lVar7 = lVar7 + -1) {
    a[lVar7] = 0;
  }
  return uVar6;
}

Assistant:

word wwShHiCarry(word a[], size_t n, size_t shift, word carry)
{
	register word ret = 0;
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * (n + 1))
	{
		size_t wshift = shift / B_PER_W;
		size_t pos;
		shift %= B_PER_W;
		// сохраняем вытесняемые разряды
		if (wshift)
			ret = a[n - wshift] << shift;
		// величина сдвига не кратна длине слова?
		if (shift)
		{
			// дополнительные вытесняемые разряды
			if (wshift < n)
				ret |= a[n - wshift - 1] >> (B_PER_W - shift);
			else
				ret |= carry >> (B_PER_W - shift);
			// сдвиг всех слов, кроме первого
			for (pos = n - 1; pos != SIZE_MAX && pos > wshift; pos--)
				a[pos] = a[pos - wshift] << shift | 
					a[pos - wshift - 1] >> (B_PER_W - shift);
			// второе слово
			if (pos != SIZE_MAX && pos + 1 > wshift)
			{
				a[pos] = a[pos - wshift] << shift | carry >> (B_PER_W - shift);
				--pos;
			}
		}
		// величина сдвига кратна длине слова
		else
		{
			for (pos = n - 1; pos != SIZE_MAX && pos + 1 > wshift; pos--)
				a[pos] = a[pos - wshift];
		}
		// первые слова
		if (pos != SIZE_MAX)
			a[pos--] = carry << shift;
		for (; pos != SIZE_MAX; a[pos--] = 0);
	}
	else
	{
		wwSetZero(a, n);
		shift -= B_PER_W * (n + 1);
		if (shift < B_PER_W)
			ret = carry << shift;

	}
	return ret;
}